

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O2

void GEN_CS::gen_cs_test_example(multi_ex *examples,label *cs_labels)

{
  bool bVar1;
  uint32_t i;
  uint32_t uVar2;
  ulong uVar3;
  wclass local_40;
  
  v_array<COST_SENSITIVE::wclass>::clear(&cs_labels->costs);
  bVar1 = CB::ec_is_example_header
                    (*(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_start);
  uVar3 = 0;
  while (uVar2 = (uint32_t)uVar3,
        uVar3 < (ulong)((long)(examples->super__Vector_base<example_*,_std::allocator<example_*>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(examples->super__Vector_base<example_*,_std::allocator<example_*>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 3)) {
    local_40.x = 3.4028235e+38;
    local_40.partial_prediction = 0.0;
    local_40.wap_value = 0.0;
    local_40.class_index = uVar2;
    if (uVar2 != 0 && bVar1) {
      local_40.class_index = uVar2 - 1;
    }
    v_array<COST_SENSITIVE::wclass>::push_back(&cs_labels->costs,&local_40);
    uVar3 = (ulong)(uVar2 + 1);
  }
  if (bVar1) {
    ((cs_labels->costs)._begin)->class_index = 0;
    ((cs_labels->costs)._begin)->x = -3.4028235e+38;
  }
  return;
}

Assistant:

void gen_cs_test_example(multi_ex& examples, COST_SENSITIVE::label& cs_labels)
{
  cs_labels.costs.clear();
  bool shared = CB::ec_is_example_header(*examples[0]);
  for (uint32_t i = 0; i < examples.size(); i++)
  {
    COST_SENSITIVE::wclass wc = {FLT_MAX, i, 0., 0.};
    if (shared && i > 0)
      wc.class_index = (uint32_t)i - 1;
    cs_labels.costs.push_back(wc);
  }

  if (shared)  // take care of shared examples
  {
    cs_labels.costs[0].class_index = 0;
    cs_labels.costs[0].x = -FLT_MAX;
  }
}